

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_26d854::OSScapture::open(OSScapture *this,char *__file,int __oflag,...)

{
  RingBuffer *ptr;
  bool bVar1;
  __atomic_base<unsigned_long> _Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ALCdevice *pAVar8;
  backend_exception *pbVar9;
  ALCchar *pAVar10;
  int *piVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  int ossFormat;
  ALuint numChannels;
  ALuint ossSpeed;
  ALuint numFragmentsLogSize;
  audio_buf_info info;
  uint local_6c;
  uint local_68;
  ALuint local_64;
  char *local_60;
  __atomic_base<unsigned_long> local_58;
  uint local_4c;
  size_t local_48 [3];
  
  if (__file == (char *)0x0) {
    pcVar16 = (char *)&(anonymous_namespace)::DefaultCapture_abi_cxx11_;
    __file = "OSS Default";
  }
  else {
    if ((anonymous_namespace)::CaptureDevices == DAT_0022d578) {
      ALCossListPopulate((vector<DevMap> *)&(anonymous_namespace)::CaptureDevices,0x10000);
    }
    lVar14 = (long)DAT_0022d578 - (long)(anonymous_namespace)::CaptureDevices;
    pcVar15 = (anonymous_namespace)::CaptureDevices;
    local_60 = DAT_0022d578;
    if (0 < lVar14 >> 8) {
      lVar13 = (lVar14 >> 8) + 1;
      do {
        iVar3 = std::__cxx11::string::compare(pcVar15);
        pcVar16 = pcVar15;
        if (iVar3 == 0) goto LAB_0016471f;
        iVar3 = std::__cxx11::string::compare(pcVar15 + 0x40);
        pcVar16 = pcVar15 + 0x40;
        if (iVar3 == 0) goto LAB_0016471f;
        iVar3 = std::__cxx11::string::compare(pcVar15 + 0x80);
        pcVar16 = pcVar15 + 0x80;
        if (iVar3 == 0) goto LAB_0016471f;
        iVar3 = std::__cxx11::string::compare(pcVar15 + 0xc0);
        pcVar16 = pcVar15 + 0xc0;
        if (iVar3 == 0) goto LAB_0016471f;
        pcVar15 = pcVar15 + 0x100;
        lVar13 = lVar13 + -1;
        lVar14 = lVar14 + -0x100;
      } while (1 < lVar13);
    }
    lVar14 = lVar14 >> 6;
    if (lVar14 == 1) {
LAB_001646ed:
      iVar3 = std::__cxx11::string::compare(pcVar15);
      pcVar16 = local_60;
      if (iVar3 == 0) {
        pcVar16 = pcVar15;
      }
    }
    else {
      pcVar16 = pcVar15;
      if (lVar14 == 2) {
LAB_001646da:
        iVar3 = std::__cxx11::string::compare(pcVar16);
        if (iVar3 != 0) {
          pcVar15 = pcVar16 + 0x40;
          goto LAB_001646ed;
        }
      }
      else {
        pcVar16 = local_60;
        if ((lVar14 == 3) &&
           (iVar3 = std::__cxx11::string::compare(pcVar15), pcVar16 = pcVar15, iVar3 != 0)) {
          pcVar16 = pcVar15 + 0x40;
          goto LAB_001646da;
        }
      }
    }
LAB_0016471f:
    if (pcVar16 == DAT_0022d578) {
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(pbVar9,0xa004,"Device name \"%s\" not found",__file);
      __cxa_throw(pbVar9,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
    }
    pcVar16 = pcVar16 + 0x20;
  }
  pcVar16 = *(char **)pcVar16;
  iVar3 = ::open(pcVar16,0);
  this->mFd = iVar3;
  if (iVar3 == -1) {
    pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar11 = __errno_location();
    pcVar15 = strerror(*piVar11);
    al::backend_exception::backend_exception(pbVar9,0xa004,"Could not open %s: %s",pcVar16,pcVar15);
  }
  else {
    local_6c = 0;
    pAVar8 = (this->super_BackendBase).mDevice;
    switch(pAVar8->FmtType) {
    case DevFmtByte:
      local_6c = 0x40;
      break;
    case DevFmtUByte:
      local_6c = 8;
      break;
    case DevFmtShort:
      local_6c = 0x10;
      break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      pAVar10 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
      al::backend_exception::backend_exception
                (pbVar9,0xa004,"%s capture samples not supported",pAVar10);
      goto LAB_00164b5a;
    }
    uVar4 = ChannelsFromDevFmt(pAVar8->FmtChans,pAVar8->mAmbiOrder);
    local_68 = uVar4;
    uVar5 = BytesFromDevFmt(((this->super_BackendBase).mDevice)->FmtType);
    pAVar8 = (this->super_BackendBase).mDevice;
    local_64 = pAVar8->Frequency;
    uVar12 = pAVar8->BufferSize * uVar5 * uVar4;
    uVar6 = 0;
    if (7 < uVar12) {
      uVar6 = 0;
      uVar12 = uVar12 >> 2;
      do {
        uVar6 = uVar6 + 1;
        bVar1 = 3 < uVar12;
        uVar12 = uVar12 >> 1;
      } while (bVar1);
    }
    local_4c = 4;
    if (4 < uVar6) {
      local_4c = uVar6;
    }
    local_4c = local_4c | 0x40000;
    local_48[0] = 0;
    local_48[1] = 0;
    iVar3 = ioctl(this->mFd,0xc004500a);
    if (iVar3 < 0) {
      pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
      piVar11 = __errno_location();
      pcVar16 = strerror(*piVar11);
      al::backend_exception::backend_exception
                (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize) failed: %s"
                 ,pcVar16);
    }
    else {
      iVar3 = ioctl(this->mFd,0xc0045005,&local_6c);
      if (iVar3 < 0) {
        pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
        piVar11 = __errno_location();
        pcVar16 = strerror(*piVar11);
        al::backend_exception::backend_exception
                  (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat) failed: %s",pcVar16);
      }
      else {
        iVar3 = ioctl(this->mFd,0xc0045006,&local_68);
        if (iVar3 < 0) {
          pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
          piVar11 = __errno_location();
          pcVar16 = strerror(*piVar11);
          al::backend_exception::backend_exception
                    (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels) failed: %s",
                     pcVar16);
        }
        else {
          iVar3 = ioctl(this->mFd,0xc0045002,&local_64);
          if (iVar3 < 0) {
            pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
            piVar11 = __errno_location();
            pcVar16 = strerror(*piVar11);
            al::backend_exception::backend_exception
                      (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed) failed: %s",pcVar16);
          }
          else {
            iVar3 = ioctl(this->mFd,0x8010500d,local_48);
            if (iVar3 < 0) {
              pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
              piVar11 = __errno_location();
              pcVar16 = strerror(*piVar11);
              al::backend_exception::backend_exception
                        (pbVar9,0xa004,"ioctl(mFd, SNDCTL_DSP_GETISPACE, &info) failed: %s",pcVar16)
              ;
            }
            else {
              pAVar8 = (this->super_BackendBase).mDevice;
              uVar7 = ChannelsFromDevFmt(pAVar8->FmtChans,pAVar8->mAmbiOrder);
              if (uVar7 == local_68) {
                if (local_6c == 8) {
                  pAVar8 = (this->super_BackendBase).mDevice;
                  if (pAVar8->FmtType == DevFmtUByte) goto LAB_001648e7;
                }
                else if (local_6c == 0x10) {
                  pAVar8 = (this->super_BackendBase).mDevice;
                  if (pAVar8->FmtType == DevFmtShort) goto LAB_001648e7;
                }
                else if ((local_6c == 0x40) &&
                        (pAVar8 = (this->super_BackendBase).mDevice, pAVar8->FmtType == DevFmtByte))
                {
LAB_001648e7:
                  RingBuffer::Create((RingBuffer *)&local_58,(ulong)pAVar8->BufferSize,
                                     (ulong)(uVar5 * uVar4),0);
                  _Var2._M_i = local_58._M_i;
                  local_58._M_i = 0;
                  ptr = (this->mRing)._M_t.
                        super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                        super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                        super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
                  (this->mRing)._M_t.
                  super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                  super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                  super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl = (RingBuffer *)_Var2._M_i
                  ;
                  if ((ptr != (RingBuffer *)0x0) &&
                     (al_free(ptr), (void *)local_58._M_i != (void *)0x0)) {
                    al_free((void *)local_58._M_i);
                  }
                  pAVar8 = (this->super_BackendBase).mDevice;
                  pcVar16 = (char *)(pAVar8->DeviceName)._M_string_length;
                  strlen(__file);
                  iVar3 = std::__cxx11::string::_M_replace
                                    ((ulong)&pAVar8->DeviceName,0,pcVar16,(ulong)__file);
                  return iVar3;
                }
                pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
                pAVar10 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
                al::backend_exception::backend_exception
                          (pbVar9,0xa004,"Failed to set %s samples, got OSS format %#x",pAVar10,
                           (ulong)local_6c);
              }
              else {
                pbVar9 = (backend_exception *)__cxa_allocate_exception(0x30);
                pAVar10 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
                al::backend_exception::backend_exception
                          (pbVar9,0xa004,"Failed to set %s, got %d channels instead",pAVar10,
                           (ulong)local_68);
              }
            }
          }
        }
      }
    }
  }
LAB_00164b5a:
  __cxa_throw(pbVar9,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void OSScapture::open(const ALCchar *name)
{
    const char *devname{DefaultCapture.c_str()};
    if(!name)
        name = DefaultName;
    else
    {
        if(CaptureDevices.empty())
            ALCossListPopulate(CaptureDevices, DSP_CAP_INPUT);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [&name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        devname = iter->device_name.c_str();
    }

    mFd = ::open(devname, O_RDONLY);
    if(mFd == -1)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open %s: %s", devname,
            strerror(errno)};

    int ossFormat{};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        ossFormat = AFMT_S8;
        break;
    case DevFmtUByte:
        ossFormat = AFMT_U8;
        break;
    case DevFmtShort:
        ossFormat = AFMT_S16_NE;
        break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }

    ALuint periods{4};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    /* according to the OSS spec, 16 bytes are the minimum */
    ALuint log2FragmentSize{maxu(log2i(mDevice->BufferSize * frameSize / periods), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
#define CHECKERR(func) if((func) < 0) {                                       \
    throw al::backend_exception{ALC_INVALID_VALUE, #func " failed: %s", strerror(errno)}; \
}
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETISPACE, &info));
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s, got %d channels instead", DevFmtChannelsString(mDevice->FmtChans),
            numChannels};

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte)
        || (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte)
        || (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s samples, got OSS format %#x", DevFmtTypeString(mDevice->FmtType),
            ossFormat};

    mRing = RingBuffer::Create(mDevice->BufferSize, frameSize, false);

    mDevice->DeviceName = name;
}